

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UgridReader.hpp
# Opt level: O0

vector<double,_std::allocator<double>_> *
Parfait::UgridReader::readNodes
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,string *filename,
          bool swapBytes)

{
  string local_88 [48];
  string local_58 [32];
  int local_38;
  int local_34;
  int nhex;
  int nprism;
  int npyr;
  int ntet;
  int nquad;
  int ntri;
  int nnodes;
  bool swapBytes_local;
  string *filename_local;
  
  ntri._3_1_ = swapBytes;
  _nnodes = filename;
  filename_local = (string *)__return_storage_ptr__;
  std::__cxx11::string::string(local_58,(string *)filename);
  readHeader((string *)local_58,&nquad,&ntet,&npyr,&nprism,&nhex,&local_34,&local_38,
             (bool)(ntri._3_1_ & 1));
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::string(local_88,(string *)filename);
  readNodes(__return_storage_ptr__,(string *)local_88,0,nquad,(bool)(ntri._3_1_ & 1));
  std::__cxx11::string::~string(local_88);
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<double> Parfait::UgridReader::readNodes(std::string filename,bool swapBytes) {
    int nnodes,ntri,nquad,ntet,npyr,nprism,nhex;
    readHeader(filename,nnodes,ntri,nquad,ntet,npyr,nprism,nhex,swapBytes);	
    return readNodes(filename,0,nnodes,swapBytes);
}